

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# millerrabin.c
# Opt level: O2

mr_result miller_rabin_test_inner(MillerRabin *mr,mp_int *mw)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  mp_int *pmVar4;
  size_t sVar5;
  mp_int *x;
  ulong uVar6;
  mp_int *b;
  ulong uVar7;
  uint uVar8;
  uint local_50;
  
  pmVar4 = monty_identity(mr->mc);
  pmVar4 = mp_copy(pmVar4);
  sVar5 = mp_max_bits(mr->pm1);
  x = mp_new(sVar5);
  uVar6 = mp_max_bits(mr->pm1);
  local_50 = 0;
  uVar8 = 0;
  uVar7 = 0;
  while (sVar5 = uVar6 - 1, 1 < uVar6) {
    monty_mul_into(mr->mc,pmVar4,pmVar4,pmVar4);
    monty_mul_into(mr->mc,x,pmVar4,mw);
    uVar1 = mp_get_bit(mr->pm1,sVar5);
    mp_select_into(pmVar4,pmVar4,x,uVar1);
    uVar1 = mp_get_bit(mr->lowbit,sVar5);
    local_50 = local_50 | uVar1;
    b = monty_identity(mr->mc);
    uVar2 = mp_cmp_eq(pmVar4,b);
    uVar3 = mp_cmp_eq(pmVar4,mr->m_pm1);
    uVar8 = uVar8 | uVar3 & local_50 | uVar2 & uVar1;
    uVar6 = sVar5;
    if (sVar5 == 1) {
      uVar7 = (ulong)uVar3;
    }
  }
  mp_free(pmVar4);
  mp_free(x);
  return (mr_result)((ulong)uVar8 | uVar7 << 0x20);
}

Assistant:

static struct mr_result miller_rabin_test_inner(MillerRabin *mr, mp_int *mw)
{
    mp_int *acc = mp_copy(monty_identity(mr->mc));
    mp_int *spare = mp_new(mp_max_bits(mr->pm1));
    size_t bit = mp_max_bits(mr->pm1);

    /*
     * The obvious approach to Miller-Rabin would be to start by
     * calling monty_pow to raise w to the power q, and then square it
     * k times ourselves. But that introduces a timing leak that gives
     * away the value of k, i.e., how many factors of 2 there are in
     * p-1.
     *
     * Instead, we don't call monty_pow at all. We do a modular
     * exponentiation ourselves to compute w^((p-1)/2), using the
     * technique that works from the top bit of the exponent
     * downwards. That is, in each iteration we compute
     * w^floor(exponent/2^i) for i one less than the previous
     * iteration, by squaring the value we previously had and then
     * optionally multiplying in w if the next exponent bit is 1.
     *
     * At the end of that process, once i <= k, the division
     * (exponent/2^i) yields an integer, so the values we're computing
     * are not just w^(floor of that), but w^(exactly that). In other
     * words, the last k intermediate values of this modexp are
     * precisely the values M-R wants to check against +1 or -1.
     *
     * So we interleave those checks with the modexp loop itself, and
     * to avoid a timing leak, we check _every_ intermediate result
     * against (the Montgomery representations of) both +1 and -1. And
     * then we do bitwise masking to arrange that only the sensible
     * ones of those checks find their way into our final answer.
     */

    unsigned active = 0;

    struct mr_result result;
    result.passed = result.potential_primitive_root = 0;

    while (bit-- > 1) {
        /*
         * In this iteration, we're computing w^(2e) or w^(2e+1),
         * where we have w^e from the previous iteration. So we square
         * the value we had already, and then optionally multiply in
         * another copy of w depending on the next bit of the exponent.
         */
        monty_mul_into(mr->mc, acc, acc, acc);
        monty_mul_into(mr->mc, spare, acc, mw);
        mp_select_into(acc, acc, spare, mp_get_bit(mr->pm1, bit));

        /*
         * mr->lowbit is a number with only one bit set, corresponding
         * to the lowest set bit in p-1. So when that's the bit of the
         * exponent we've just processed, we'll detect it by setting
         * first_iter to true. That's our indication that we're now
         * generating intermediate results useful to M-R, so we also
         * set 'active', which stays set from then on.
         */
        unsigned first_iter = mp_get_bit(mr->lowbit, bit);
        active |= first_iter;

        /*
         * Check the intermediate result against both +1 and -1.
         */
        unsigned is_plus_1 = mp_cmp_eq(acc, monty_identity(mr->mc));
        unsigned is_minus_1 = mp_cmp_eq(acc, mr->m_pm1);

        /*
         * M-R must report success iff either: the first of the useful
         * intermediate results (which is w^q) is 1, or _any_ of them
         * (from w^q all the way up to w^((p-1)/2)) is -1.
         *
         * So we want to pass the test if is_plus_1 is set on the
         * first iteration, or if is_minus_1 is set on any iteration.
         */
        result.passed |= (first_iter & is_plus_1);
        result.passed |= (active & is_minus_1);

        /*
         * In the final iteration, is_minus_1 is also used to set the
         * 'potential primitive root' flag, because we haven't found
         * any exponent smaller than p-1 for which w^(that) == 1.
         */
        if (bit == 1)
            result.potential_primitive_root = is_minus_1;
    }

    mp_free(acc);
    mp_free(spare);

    return result;
}